

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

int yy_expression(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int yythunkpos93;
  int yypos93;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar3 = yy_sequence(G);
  if (iVar3 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
    G_local._4_4_ = 0;
  }
  else {
    while( true ) {
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      iVar3 = yy_BAR(G);
      if ((iVar3 == 0) || (iVar3 = yy_sequence(G), iVar3 == 0)) break;
      yyDo(G,yy_1_expression,G->begin,G->end,"yy_1_expression");
    }
    G->pos = iVar1;
    G->thunkpos = iVar2;
    G_local._4_4_ = 1;
  }
  return G_local._4_4_;
}

Assistant:

YY_RULE(int) yy_expression(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "expression"));
  if (!yy_sequence(G))  goto l91;

  l92:;	
  {  int yypos93= G->pos, yythunkpos93= G->thunkpos;  if (!yy_BAR(G))  goto l93;
  if (!yy_sequence(G))  goto l93;
  yyDo(G, yy_1_expression, G->begin, G->end, "yy_1_expression");
  goto l92;
  l93:;	  G->pos= yypos93; G->thunkpos= yythunkpos93;
  }  yyprintf((stderr, "  ok   expression"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l91:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "expression"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}